

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

_Bool aa64_generate_debug_exceptions(CPUARMState_conflict *env)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  int debug_el;
  int cur_el;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_current_el(env);
  if (iVar2 == 3) {
    env_local._7_1_ = false;
  }
  else {
    _Var1 = arm_is_secure_below_el3(env);
    if ((_Var1) && (uVar4 = extract32((uint32_t)(env->cp15).mdcr_el3,0x10,1), uVar4 != 0)) {
      env_local._7_1_ = false;
    }
    else {
      iVar3 = arm_debug_target_el(env);
      if (iVar2 == iVar3) {
        uVar4 = extract32((uint32_t)(env->cp15).mdscr_el1,0xd,1);
        env_local._7_1_ = false;
        if (uVar4 != 0) {
          env_local._7_1_ = (env->daif & 0x200) == 0;
        }
      }
      else {
        env_local._7_1_ = iVar2 < iVar3;
      }
    }
  }
  return env_local._7_1_;
}

Assistant:

static inline bool aa64_generate_debug_exceptions(CPUARMState *env)
{
    int cur_el = arm_current_el(env);
    int debug_el;

    if (cur_el == 3) {
        return false;
    }

    /* MDCR_EL3.SDD disables debug events from Secure state */
    if (arm_is_secure_below_el3(env)
        && extract32(env->cp15.mdcr_el3, 16, 1)) {
        return false;
    }

    /*
     * Same EL to same EL debug exceptions need MDSCR_KDE enabled
     * while not masking the (D)ebug bit in DAIF.
     */
    debug_el = arm_debug_target_el(env);

    if (cur_el == debug_el) {
        return extract32(env->cp15.mdscr_el1, 13, 1)
            && !(env->daif & PSTATE_D);
    }

    /* Otherwise the debug target needs to be a higher EL */
    return debug_el > cur_el;
}